

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O2

void __thiscall pg::SPMSolver::pm_stream(SPMSolver *this,ostream *out,int *pm)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  int iVar5;
  
  iVar1 = pm[1];
  iVar2 = *pm;
  std::operator<<(out," {");
  if (iVar2 == -1) {
    std::operator<<(out," \x1b[1;33mTe\x1b[m");
  }
  else {
    poVar3 = std::operator<<(out," ");
    std::ostream::operator<<(poVar3,*pm);
  }
  if (iVar1 == -1) {
    std::operator<<(out," \x1b[1;33mTo\x1b[m");
  }
  else {
    poVar3 = std::operator<<(out," ");
    std::ostream::operator<<(poVar3,pm[1]);
  }
  uVar4 = 2;
  do {
    if (this->k <= (long)uVar4) {
      std::operator<<(out," } ");
      return;
    }
    poVar3 = std::operator<<(out," ");
    if ((uVar4 & 1) == 0) {
      if (iVar2 != -1) goto LAB_00153795;
LAB_001537a2:
      iVar5 = 0;
    }
    else {
      if (iVar1 == -1) goto LAB_001537a2;
LAB_00153795:
      iVar5 = pm[uVar4];
    }
    std::ostream::operator<<(poVar3,iVar5);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void
SPMSolver::pm_stream(std::ostream &out, int *pm)
{
    bool top_e = pm[0] == -1;
    bool top_o = pm[1] == -1;
    out << " {";
    if (top_e) out << " \033[1;33mTe\033[m";
    else out << " " << pm[0];
    if (top_o) out << " \033[1;33mTo\033[m";
    else out << " " << pm[1];
    for (int i=2; i<k; i++) {
        if (i&1) out << " " << (top_o ? 0 : pm[i]);
        else     out << " " << (top_e ? 0 : pm[i]);
    }
    out << " } ";
}